

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

value_type __thiscall
gnuplotio::
IteratorRange<__gnu_cxx::__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,_signed_char>
::deref(IteratorRange<__gnu_cxx::__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,_signed_char>
        *this)

{
  bool bVar1;
  runtime_error *this_00;
  reference pcVar2;
  IteratorRange<__gnu_cxx::__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>,_signed_char>
  *this_local;
  
  bVar1 = is_end(this);
  if (!bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
             ::operator*(&this->it);
    return *pcVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"attepted to dereference past end of iterator");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

value_type deref() const {
        static_assert(sizeof(TV) && !is_container,
            "deref called on nested container");
        if(is_end()) {
            throw std::runtime_error("attepted to dereference past end of iterator");
        }
        return *it;
    }